

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall application::Chat::moveCursor(Chat *this,int x,int y)

{
  wostream *pwVar1;
  int y_local;
  int x_local;
  Chat *this_local;
  
  if (x < 1) {
    if (x < 0) {
      pwVar1 = std::operator<<((wostream *)&std::wcout,"\x1b[");
      if (x < 1) {
        x = -x;
      }
      pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,x);
      std::operator<<(pwVar1,"D");
    }
  }
  else {
    pwVar1 = std::operator<<((wostream *)&std::wcout,"\x1b[");
    pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,x);
    std::operator<<(pwVar1,"C");
  }
  if (y < 1) {
    if (y < 0) {
      pwVar1 = std::operator<<((wostream *)&std::wcout,"\x1b[");
      if (y < 1) {
        y = -y;
      }
      pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,y);
      std::operator<<(pwVar1,"B");
    }
  }
  else {
    pwVar1 = std::operator<<((wostream *)&std::wcout,"\x1b[");
    pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,y);
    std::operator<<(pwVar1,"A");
  }
  return;
}

Assistant:

void Chat::moveCursor(const int x, const int y)
{
#ifdef _WIN32
	CONSOLE_SCREEN_BUFFER_INFO sbi;
	COORD position;
	GetConsoleScreenBufferInfo(GetStdHandle(STD_OUTPUT_HANDLE), &sbi);
	position.X = sbi.dwCursorPosition.X + x;
	position.Y = sbi.dwCursorPosition.Y - y;
	SetConsoleCursorPosition(GetStdHandle(STD_OUTPUT_HANDLE), position);
#else
	if (x > 0)
		std::wcout << "\033[" << x << "C";
	else if (x < 0)
		std::wcout << "\033[" << abs(x) << "D";

	if (y > 0)
		std::wcout << "\033[" << y << "A";
	else if (y < 0)
		std::wcout << "\033[" << abs(y) << "B";
#endif
}